

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkPrintDistrib(Cba_Ntk_t *p,int fVerbose)

{
  byte bVar1;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  int *piVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined8 *__ptr;
  void *pvVar13;
  Vec_Ptr_t *vTypes;
  void **ppvVar14;
  Vec_Ptr_t *vOccurs;
  void **__s;
  undefined8 *puVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  word Entry;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  double dVar24;
  char *pTypeNames [90];
  char *local_308 [91];
  
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 0x5a;
  pvVar13 = malloc(0x168);
  __ptr[1] = pvVar13;
  *(undefined4 *)((long)__ptr + 4) = 0x5a;
  if (pvVar13 != (void *)0x0) {
    memset(pvVar13,0,0x168);
  }
  Cba_ManCreatePrimMap(local_308);
  vTypes = (Vec_Ptr_t *)malloc(0x10);
  vTypes->nCap = 0x5a;
  vTypes->nSize = 0;
  ppvVar14 = (void **)malloc(0x2d0);
  vTypes->pArray = ppvVar14;
  vTypes->nSize = 0x5a;
  lVar21 = 0;
  memset(ppvVar14,0,0x2d0);
  vOccurs = (Vec_Ptr_t *)malloc(0x10);
  vOccurs->nCap = 0x5a;
  vOccurs->nSize = 0;
  __s = (void **)malloc(0x2d0);
  vOccurs->pArray = __s;
  vOccurs->nSize = 0x5a;
  memset(__s,0,0x2d0);
  do {
    puVar15 = (undefined8 *)malloc(0x10);
    *puVar15 = 0x10;
    pvVar13 = malloc(0x80);
    puVar15[1] = pvVar13;
    ppvVar14[lVar21] = puVar15;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x5a);
  lVar21 = 0;
  do {
    puVar15 = (undefined8 *)malloc(0x10);
    *puVar15 = 0x10;
    pvVar13 = malloc(0x80);
    puVar15[1] = pvVar13;
    __s[lVar21] = puVar15;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x5a);
  if ((p->vObjType).nSize < 2) {
    uVar22 = 0xffffffff;
    uVar20 = 0;
  }
  else {
    uVar22 = 0xffffffff;
    uVar18 = 1;
    uVar20 = 0;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar18) {
LAB_003d8722:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = (p->vObjType).pArray[uVar18];
      uVar16 = (ulong)bVar1;
      if (bVar1 != 0) {
        iVar7 = (int)uVar18;
        uVar4 = Cba_FonRangeSize(p,iVar7);
        Cba_ObjSigned(p,iVar7);
        if ((int)uVar4 < 0) goto LAB_003d8741;
        if (0xfffff < uVar4) {
          if (((long)(p->vObjFon0).nSize <= (long)uVar18) ||
             (uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]),
             (long)(p->vObjFon0).nSize <= (long)uVar18)) goto LAB_003d8703;
          uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]);
          printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
                 uVar18 & 0xffffffff,(ulong)uVar4,(ulong)(uVar5 & 0xfffff));
        }
        iVar6 = Cba_ObjLeft(p,iVar7);
        if ((iVar6 != 0) && (iVar6 = Cba_ObjRight(p,iVar7), iVar6 != 0)) {
          if (uVar22 == 0xffffffff) {
            uVar22 = 1;
          }
          uVar20 = (ulong)((int)uVar20 + 1);
        }
        if ((long)(p->vObjType).nSize <= (long)uVar18) goto LAB_003d8722;
        if ((p->vObjType).pArray[uVar18] == '\x01') {
LAB_003d6839:
          iVar6 = Cba_FonRangeSize(p,iVar7);
          iVar7 = Cba_ObjSigned(p,iVar7);
          if (iVar6 < 0) {
LAB_003d8741:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Entry = (word)(uint)(iVar7 + iVar6 * 2);
        }
        else if (bVar1 < 0x3a) {
          if ((0x380000200000200U >> (uVar16 & 0x3f) & 1) == 0) {
            if (uVar16 != 8) goto LAB_003d6a35;
            if ((long)uVar18 < (long)(p->vObjFin0).nSize) {
              iVar6 = (p->vObjFin0).pArray[uVar18];
              if ((long)iVar6 < 1) goto LAB_003d8760;
              if (iVar6 < (p->vFinFon).nSize) {
                if ((p->vFinFon).pArray[iVar6] < 0) goto LAB_003d6839;
                if (bVar1 < 0x3a) goto LAB_003d687d;
                goto LAB_003d6a3e;
              }
            }
            goto LAB_003d8703;
          }
LAB_003d687d:
          iVar6 = Cba_FonRangeSize(p,iVar7);
          iVar7 = Cba_ObjSigned(p,iVar7);
          if (iVar6 < 0) goto LAB_003d8741;
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
LAB_003d68b6:
          iVar9 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar9 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar9) goto LAB_003d8703;
          iVar9 = (p->vFinFon).pArray[iVar9];
          iVar8 = Cba_FonRangeSize(p,iVar9);
          iVar9 = Cba_ObjSigned(p,iVar9);
          if (iVar8 < 0) goto LAB_003d8741;
          Entry = (ulong)(uint)(iVar7 + iVar6 * 2) | (ulong)(uint)(iVar9 + iVar8 * 2) << 0x15;
        }
        else {
LAB_003d6a35:
          if (bVar1 == 0x59) goto LAB_003d6839;
LAB_003d6a3e:
          if (0xfffffff9 < bVar1 - 0x21) goto LAB_003d687d;
          if ((long)(p->vObjFin0).nSize <= (long)(uVar18 + 1)) goto LAB_003d8703;
          piVar2 = (p->vObjFin0).pArray;
          iVar6 = piVar2[uVar18 + 1] - piVar2[uVar18];
          if (iVar6 == 1) {
            iVar6 = Cba_FonRangeSize(p,iVar7);
            iVar7 = Cba_ObjSigned(p,iVar7);
            if (iVar6 < 0) goto LAB_003d8741;
            if ((long)uVar18 < (long)(p->vObjFin0).nSize) goto LAB_003d68b6;
            goto LAB_003d8703;
          }
          if (iVar6 < 2) {
            __assert_fail("Cba_ObjFinNum(p, i) >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaNtk.c"
                          ,0x82,"void Cba_NtkPrintDistrib(Cba_Ntk_t *, int)");
          }
          iVar6 = Cba_FonRangeSize(p,iVar7);
          iVar7 = Cba_ObjSigned(p,iVar7);
          if (iVar6 < 0) goto LAB_003d8741;
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar9 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar9 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar9) goto LAB_003d8703;
          iVar9 = (p->vFinFon).pArray[iVar9];
          iVar8 = Cba_FonRangeSize(p,iVar9);
          iVar9 = Cba_ObjSigned(p,iVar9);
          if (iVar8 < 0) goto LAB_003d8741;
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar11 = (p->vObjFin0).pArray[uVar18];
          if (iVar11 < 0) goto LAB_003d8760;
          uVar4 = iVar11 + 1;
          if ((p->vFinFon).nSize <= (int)uVar4) goto LAB_003d8703;
          iVar11 = (p->vFinFon).pArray[uVar4];
          iVar10 = Cba_FonRangeSize(p,iVar11);
          iVar11 = Cba_ObjSigned(p,iVar11);
          if (iVar10 < 0) goto LAB_003d8741;
          Entry = (ulong)(uint)(iVar7 + iVar6 * 2) | (ulong)(uint)(iVar9 + iVar8 * 2) << 0x15 |
                  (ulong)(uint)(iVar11 + iVar10 * 2) << 0x2a;
        }
        uVar4 = (uint)bVar1;
        if ((vTypes->nSize <= (int)uVar4) || (vOccurs->nSize <= (int)uVar4)) goto LAB_003d86e4;
        p_00 = (Vec_Wrd_t *)vTypes->pArray[uVar16];
        p_01 = (Vec_Wrd_t *)vOccurs->pArray[uVar16];
        if (0 < (long)p_00->nSize) {
          lVar21 = 0;
          do {
            if (p_00->pArray[lVar21] == Entry) {
              if (p_01->nSize <= (int)lVar21) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                              ,0x1e0,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
              }
              p_01->pArray[lVar21] = p_01->pArray[lVar21] + 1;
              goto code_r0x003d69b9;
            }
            lVar21 = lVar21 + 1;
          } while (p_00->nSize != lVar21);
        }
        Vec_WrdPush(p_00,Entry);
        Vec_WrdPush(p_01,1);
code_r0x003d69b9:
        switch(uVar4) {
        case 9:
          if (*(int *)((long)__ptr + 4) < 10) {
LAB_003d879e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          break;
        case 10:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0xb) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x28) = *(int *)(__ptr[1] + 0x28) + iVar7;
          break;
        case 0xc:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0xd) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x30) = *(int *)(__ptr[1] + 0x30) + iVar7;
          break;
        case 0xe:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0xf) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x38) = *(int *)(__ptr[1] + 0x38) + iVar7 * 3;
          break;
        case 0x12:
          if (((long)(p->vObjFon0).nSize <= (long)uVar18) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]),
             (long)(p->vObjFin0).nSize <= (long)(uVar18 + 1))) goto LAB_003d8703;
          if (*(int *)((long)__ptr + 4) < 0x13) goto LAB_003d879e;
          piVar2 = (p->vObjFin0).pArray;
          *(int *)(__ptr[1] + 0x48) =
               *(int *)(__ptr[1] + 0x48) + iVar7 * ((piVar2[uVar18 + 1] - piVar2[uVar18]) + -2) * 3;
          break;
        case 0x1b:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x1c) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x6c) = iVar7 + *(int *)(__ptr[1] + 0x6c) + -1;
          break;
        case 0x1d:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x1e) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x74) = iVar7 + *(int *)(__ptr[1] + 0x74) + -1;
          break;
        case 0x1f:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x20) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x7c) = iVar7 * 3 + *(int *)(__ptr[1] + 0x7c) + -3;
          break;
        case 0x21:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x22) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x84) = iVar7 + *(int *)(__ptr[1] + 0x84) + -1;
          break;
        case 0x22:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) {
LAB_003d8760:
            __assert_fail("f>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                          ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
          }
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if (iVar6 < 0) goto LAB_003d8760;
          uVar4 = iVar6 + 1;
          if ((p->vFinFon).nSize <= (int)uVar4) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[uVar4];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]);
          if (*(int *)((long)__ptr + 4) < 0x23) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x88) = *(int *)(__ptr[1] + 0x88) + iVar7 + iVar6 + -1;
          break;
        case 0x24:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if (iVar6 < 0) goto LAB_003d8760;
          uVar4 = iVar6 + 1;
          if ((p->vFinFon).nSize <= (int)uVar4) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[uVar4];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]);
          if (*(int *)((long)__ptr + 4) < 0x25) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x90) = *(int *)(__ptr[1] + 0x90) + iVar7 + iVar6 + -1;
          break;
        case 0x26:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if (iVar6 < 0) goto LAB_003d8760;
          uVar4 = iVar6 + 1;
          if ((p->vFinFon).nSize <= (int)uVar4) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[uVar4];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]);
          if (*(int *)((long)__ptr + 4) < 0x27) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x98) = *(int *)(__ptr[1] + 0x98) + iVar7 + iVar6 + 1;
          break;
        case 0x2f:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x30) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xbc) = *(int *)(__ptr[1] + 0xbc) + iVar7 * 9;
          break;
        case 0x30:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x31) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xc0) = *(int *)(__ptr[1] + 0xc0) + iVar7 * 9;
          break;
        case 0x31:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if (iVar6 < 0) goto LAB_003d8760;
          uVar4 = iVar6 + 1;
          if ((p->vFinFon).nSize <= (int)uVar4) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[uVar4];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]);
          if (*(int *)((long)__ptr + 4) < 0x32) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xc4) = *(int *)(__ptr[1] + 0xc4) + iVar7 * 9 * iVar6;
          break;
        case 0x33:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar6) ||
             (iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar9 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar9 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar9) goto LAB_003d8703;
          iVar9 = (p->vFinFon).pArray[iVar9];
          if ((long)iVar9 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar9) goto LAB_003d8703;
          iVar9 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar9]);
          if (*(int *)((long)__ptr + 4) < 0x34) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xcc) =
               iVar9 * -0x13 + iVar7 * 0xd * iVar6 + *(int *)(__ptr[1] + 0xcc) + 10;
          break;
        case 0x34:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar6) ||
             (iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar9 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar9 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar9) goto LAB_003d8703;
          iVar9 = (p->vFinFon).pArray[iVar9];
          if ((long)iVar9 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar9) goto LAB_003d8703;
          iVar9 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar9]);
          if (*(int *)((long)__ptr + 4) < 0x35) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xd0) =
               iVar9 * -7 + iVar7 * 0xd * iVar6 + *(int *)(__ptr[1] + 0xd0) + -2;
          break;
        case 0x36:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]);
          dVar24 = pow((double)iVar7,(double)iVar6);
          if (*(int *)((long)__ptr + 4) < 0x37) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xd8) = *(int *)(__ptr[1] + 0xd8) + (int)dVar24 * 10;
          break;
        case 0x37:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x38) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xdc) = *(int *)(__ptr[1] + 0xdc) + iVar7 * 4;
          break;
        case 0x38:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]);
          iVar6 = iVar6 * iVar7 * 0xb;
          iVar7 = iVar6 + 7;
          if (-1 < iVar6) {
            iVar7 = iVar6;
          }
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]);
          if (*(int *)((long)__ptr + 4) < 0x39) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xe0) =
               (iVar6 * 5) / 2 + (iVar7 >> 3) + *(int *)(__ptr[1] + 0xe0) + -5;
          break;
        case 0x3b:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x3c) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xec) = *(int *)(__ptr[1] + 0xec) + iVar7 * 6 + -6;
          break;
        case 0x3c:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x3d) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xf0) = *(int *)(__ptr[1] + 0xf0) + iVar7 * 6 + -6;
          break;
        case 0x3d:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x3e) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xf4) = *(int *)(__ptr[1] + 0xf4) + iVar7 * 6 + -6;
          break;
        case 0x3e:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x3f) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xf8) = *(int *)(__ptr[1] + 0xf8) + iVar7 * 6 + -6;
          break;
        case 0x3f:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x40) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0xfc) = *(int *)(__ptr[1] + 0xfc) + iVar7 * 4 + -1;
          break;
        case 0x40:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (*(int *)((long)__ptr + 4) < 0x41) goto LAB_003d879e;
          *(int *)(__ptr[1] + 0x100) = *(int *)(__ptr[1] + 0x100) + iVar7 * 4 + -1;
          break;
        case 0x41:
          if (((long)(p->vObjFon0).nSize <= (long)uVar18) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar6) ||
             (uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]),
             (long)(p->vObjFon0).nSize <= (long)uVar18)) goto LAB_003d8703;
          uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]);
          if (1 < uVar5) {
            uVar5 = uVar5 - 1;
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar12 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar5 = (uVar12 ^ 0xffffffe0) + 0x21;
            }
          }
          if (*(int *)((long)__ptr + 4) < 0x42) goto LAB_003d879e;
          if ((int)uVar4 < (int)uVar5) {
            uVar5 = uVar4;
          }
          *(int *)(__ptr[1] + 0x104) = *(int *)(__ptr[1] + 0x104) + iVar7 * uVar5 * 3;
          break;
        case 0x42:
          if ((long)(p->vObjFin0).nSize <= (long)uVar18) goto LAB_003d8703;
          iVar7 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar7 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003d8703;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFon0).nSize <= (long)uVar18)) goto LAB_003d8703;
          uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]);
          if (1 < uVar5) {
            uVar5 = uVar5 - 1;
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar12 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar5 = (uVar12 ^ 0xffffffe0) + 0x21;
            }
          }
          if (*(int *)((long)__ptr + 4) < 0x43) goto LAB_003d879e;
          if ((int)uVar4 < (int)uVar5) {
            uVar5 = uVar4;
          }
          *(int *)(__ptr[1] + 0x108) = *(int *)(__ptr[1] + 0x108) + uVar5 * 3;
          break;
        case 0x43:
          if (((long)(p->vObjFon0).nSize <= (long)uVar18) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar6) ||
             (uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]),
             (long)(p->vObjFon0).nSize <= (long)uVar18)) goto LAB_003d8703;
          uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]);
          if (1 < uVar5) {
            uVar5 = uVar5 - 1;
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar12 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar5 = (uVar12 ^ 0xffffffe0) + 0x21;
            }
          }
          if (*(int *)((long)__ptr + 4) < 0x44) goto LAB_003d879e;
          if ((int)uVar4 < (int)uVar5) {
            uVar5 = uVar4;
          }
          *(int *)(__ptr[1] + 0x10c) = *(int *)(__ptr[1] + 0x10c) + iVar7 * uVar5 * 3;
          break;
        case 0x44:
          if (((long)(p->vObjFon0).nSize <= (long)uVar18) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar6) ||
             (uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]),
             (long)(p->vObjFon0).nSize <= (long)uVar18)) goto LAB_003d8703;
          uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]);
          if (1 < uVar5) {
            uVar5 = uVar5 - 1;
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar12 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar5 = (uVar12 ^ 0xffffffe0) + 0x21;
            }
          }
          if (*(int *)((long)__ptr + 4) < 0x45) goto LAB_003d879e;
          if ((int)uVar4 < (int)uVar5) {
            uVar5 = uVar4;
          }
          *(int *)(__ptr[1] + 0x110) = *(int *)(__ptr[1] + 0x110) + iVar7 * uVar5 * 3;
          break;
        case 0x45:
          if (((long)(p->vObjFon0).nSize <= (long)uVar18) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar6) ||
             (uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]),
             (long)(p->vObjFon0).nSize <= (long)uVar18)) goto LAB_003d8703;
          uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]);
          if (1 < uVar5) {
            uVar5 = uVar5 - 1;
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar12 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar5 = (uVar12 ^ 0xffffffe0) + 0x21;
            }
          }
          if (*(int *)((long)__ptr + 4) < 0x46) goto LAB_003d879e;
          if ((int)uVar4 < (int)uVar5) {
            uVar5 = uVar4;
          }
          *(int *)(__ptr[1] + 0x114) = *(int *)(__ptr[1] + 0x114) + iVar7 * uVar5 * 3;
          break;
        case 0x46:
          if (((long)(p->vObjFon0).nSize <= (long)uVar18) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]),
             (long)(p->vObjFin0).nSize <= (long)uVar18)) goto LAB_003d8703;
          iVar6 = (p->vObjFin0).pArray[uVar18];
          if ((long)iVar6 < 1) goto LAB_003d8760;
          if ((p->vFinFon).nSize <= iVar6) goto LAB_003d8703;
          iVar6 = (p->vFinFon).pArray[iVar6];
          if ((long)iVar6 < 1) goto LAB_003d877f;
          if (((p->vObjFon0).nSize <= iVar6) ||
             (uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar6]),
             (long)(p->vObjFon0).nSize <= (long)uVar18)) goto LAB_003d8703;
          uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar18]);
          if (1 < uVar5) {
            uVar5 = uVar5 - 1;
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar12 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar5 = (uVar12 ^ 0xffffffe0) + 0x21;
            }
          }
          if (*(int *)((long)__ptr + 4) < 0x47) goto LAB_003d879e;
          if ((int)uVar4 < (int)uVar5) {
            uVar5 = uVar4;
          }
          *(int *)(__ptr[1] + 0x118) = *(int *)(__ptr[1] + 0x118) + iVar7 * uVar5 * 3;
          break;
        case 0x58:
          if (*(int *)((long)__ptr + 4) < 0x59) goto LAB_003d879e;
          break;
        case 0x59:
          if (*(int *)((long)__ptr + 4) < 0x5a) goto LAB_003d879e;
        }
      }
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)(p->vObjType).nSize);
  }
  if ((int)uVar20 == 0) {
LAB_003d8374:
    puts(
        "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ..."
        );
    uVar22 = vTypes->nSize;
    if (vTypes->nSize < 1) {
      uVar22 = 0;
    }
    pcVar17 = "-";
    uVar20 = 0;
    do {
      if ((uVar20 == uVar22) || ((long)vOccurs->nSize <= (long)uVar20)) {
LAB_003d86e4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar4 = p->pDesign->nObjs[uVar20];
      if (uVar4 != 0) {
        if ((long)*(int *)((long)__ptr + 4) <= (long)uVar20) goto LAB_003d8703;
        pvVar13 = vTypes->pArray[uVar20];
        pvVar3 = vOccurs->pArray[uVar20];
        printf("%2d  :  %-8s  %6d%8d ",uVar20,local_308[uVar20],(ulong)uVar4,
               (ulong)*(uint *)(__ptr[1] + uVar20 * 4));
        Cba_NtkPrintDistribSortOne(vTypes,vOccurs,(int)uVar20);
        if (0 < *(int *)((long)pvVar13 + 4)) {
          uVar18 = 0;
          do {
            uVar16 = *(ulong *)(*(long *)((long)pvVar13 + 8) + uVar18 * 8);
            if ((((int)(uVar18 / 6) * 6 + 5U == (uint)uVar18) && (0x3ffffffffff < uVar16)) ||
               (((~(uint)uVar18 & 7) == 0 && (uVar16 < 0x40000000000)))) {
              printf("\n                                ");
            }
            if ((long)*(int *)((long)pvVar3 + 4) <= (long)uVar18) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
            }
            uVar23 = uVar16 >> 0x15;
            printf("(%d)",(ulong)*(uint *)(*(long *)((long)pvVar3 + 8) + uVar18 * 8));
            pcVar19 = pcVar17;
            if ((uVar16 & 1) == 0) {
              pcVar19 = "";
            }
            printf("%s%d",pcVar19,(ulong)((uint)(uVar16 >> 1) & 0xfffff));
            if ((uVar23 & 0x1fffff) != 0) {
              pcVar19 = pcVar17;
              if ((uVar23 & 1) == 0) {
                pcVar19 = "";
              }
              printf("=%s%d",pcVar19,(ulong)(((uint)uVar23 & 0x1fffff) >> 1));
            }
            if (0x3ffffffffff < uVar16) {
              pcVar19 = pcVar17;
              if ((uVar16 >> 0x2a & 1) == 0) {
                pcVar19 = "";
              }
              printf(".%s%d",pcVar19,uVar16 >> 0x2b);
            }
            putchar(0x20);
            uVar18 = uVar18 + 1;
          } while ((long)uVar18 < (long)*(int *)((long)pvVar13 + 4));
        }
        putchar(10);
      }
      uVar20 = uVar20 + 1;
      if (uVar20 == 0x5a) {
        iVar7 = vTypes->nSize;
        if (0 < (long)iVar7) {
          ppvVar14 = vTypes->pArray;
          lVar21 = 0;
          do {
            pvVar13 = ppvVar14[lVar21];
            if (pvVar13 != (void *)0x0) {
              if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar13 + 8));
                *(undefined8 *)((long)pvVar13 + 8) = 0;
              }
              free(pvVar13);
            }
            lVar21 = lVar21 + 1;
          } while (iVar7 != lVar21);
        }
        if (vTypes->pArray != (void **)0x0) {
          free(vTypes->pArray);
          vTypes->pArray = (void **)0x0;
        }
        free(vTypes);
        iVar7 = vOccurs->nSize;
        if (0 < (long)iVar7) {
          ppvVar14 = vOccurs->pArray;
          lVar21 = 0;
          do {
            pvVar13 = ppvVar14[lVar21];
            if (pvVar13 != (void *)0x0) {
              if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar13 + 8));
                *(undefined8 *)((long)pvVar13 + 8) = 0;
              }
              free(pvVar13);
            }
            lVar21 = lVar21 + 1;
          } while (iVar7 != lVar21);
        }
        if (vOccurs->pArray != (void **)0x0) {
          free(vOccurs->pArray);
          vOccurs->pArray = (void **)0x0;
        }
        free(vOccurs);
        if ((void *)__ptr[1] != (void *)0x0) {
          free((void *)__ptr[1]);
          __ptr[1] = 0;
        }
        free(__ptr);
        return;
      }
    } while( true );
  }
  printf("Warning: %d objects of the design have non-zero-based ranges.\n",uVar20);
  if ((int)uVar22 < 1) {
LAB_003d877f:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                  ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
  }
  if ((p->vObjFon0).nSize <= (int)uVar22) {
LAB_003d8703:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vFonName).nSize < 1) {
    pcVar17 = "Cba_NtkHasFonNames(p)";
  }
  else {
    uVar4 = (p->vObjFon0).pArray[uVar22];
    if (0 < (int)uVar4) {
      Vec_IntFillExtra(&p->vFonName,uVar4 + 1,0);
      if (((int)uVar4 < (p->vFonName).nSize) &&
         (pcVar17 = Abc_NamStr(p->pDesign->pStrs,(p->vFonName).pArray[uVar4]),
         (int)uVar22 < (p->vObjFon0).nSize)) {
        uVar4 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar22]);
        uVar5 = Cba_ObjLeft(p,uVar22);
        uVar12 = Cba_ObjRight(p,uVar22);
        printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",(ulong)uVar22,
               pcVar17,(ulong)uVar4,(ulong)uVar5,(ulong)uVar12);
        goto LAB_003d8374;
      }
      goto LAB_003d8703;
    }
    pcVar17 = "Cba_FonIsReal(f)";
  }
  __assert_fail(pcVar17,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                ,0x11e,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
}

Assistant:

void Cba_NtkPrintDistrib( Cba_Ntk_t * p, int fVerbose )
{
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( CBA_BOX_LAST );
    int iRnObj = -1, nCountRange = 0;
    int i, k, s, s0, s1;  word Sign;
    Cba_ObjType_t Type;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( CBA_BOX_LAST );
    vOccurs = Vec_PtrStart( CBA_BOX_LAST );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Cba_NtkForEachObj( p, i )
    {
//        char * pName = Cba_ObjName(p, i);
        Type = Cba_ObjType( p, i );
        if ( Cba_ObjSign(p, i) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Cba_ObjRangeSize(p, i), Cba_ObjRangeSize(p, i) & 0xFFFFF );
        if ( Cba_ObjLeft(p, i) && Cba_ObjRight(p, i) )
        {
            if ( iRnObj == -1 )
                iRnObj = 1;
            nCountRange++;
        }
        // 0-input types
        if ( Cba_ObjIsPi(p, i) || (Type == CBA_BOX_BUF && Cba_FonIsConst(Cba_ObjFinFon(p, i, 0))) || Type == CBA_BOX_CONCAT )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), 0, 0 );
        // 1-input types
        else if ( Cba_TypeIsUnary(Type)  )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        // 2-input types (including MUX)
        else if ( Cba_ObjFinNum(p, i) == 1 )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        else
        {
            assert( Cba_ObjFinNum(p, i) >= 2 );
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 1)) );
        }
        // add to storage
        Cba_NtkPrintDistribAddOne( vTypes, vOccurs, Type, Sign );
        // count the number of AIG nodes
        if ( Type == CBA_BOX_MUX )
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUX,      3 * Cba_ObjRangeSize(p, i) * (Cba_ObjFinNum(p, i) - 2) );
        else if ( Type == CBA_BOX_SHIR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIR,  Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIRA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIRA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIL )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHILA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHILA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTR,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTL )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_INV )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_INV, 0 );
        else if ( Type == CBA_BOX_AND )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_AND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_OR )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_OR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_XOR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_XOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SLICE )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_SLICE, 0 );
        else if ( Type == CBA_BOX_CONCAT )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_CONCAT, 0 );
        else if ( Type == CBA_BOX_LNOT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LNOT,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LAND )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LAND,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LOR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_LOR,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LXOR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LXOR,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) + 1 );
        else if ( Type == CBA_BOX_EQU )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_EQU,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_NEQU )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_NEQU,     4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_MTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_LETHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_LETHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_METHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_METHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_RAND )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RAND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_ROR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_RXOR )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RXOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 3 );
        else if ( Type == CBA_BOX_ADD )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_ADD,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SUB )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_SUB,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_MUL )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUL,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) );
        else if ( Type == CBA_BOX_DIV )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_DIV,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 19 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + 10 );
        else if ( Type == CBA_BOX_MOD )  
            Vec_IntAddToEntry( vAnds, CBA_BOX_MOD,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 7 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 2  );
        else if ( Type == CBA_BOX_POW ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_POW,     10 * (int)pow((double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)),(double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0))) );
        else if ( Type == CBA_BOX_MIN )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_MIN,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SQRT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_SQRT,    11 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 8 + 5 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 2 - 5  );
    }
    if ( nCountRange )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", 
            iRnObj, Cba_FonNameStr(p, Cba_ObjFon0(p, iRnObj)), 
            Cba_ObjRangeSize(p, iRnObj), Cba_ObjLeft(p, iRnObj), Cba_ObjRight(p, iRnObj) );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n" );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->pDesign->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d%8d ", i, pTypeNames[i], p->pDesign->nObjs[i], Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Cba_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Cba_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
                printf( "\n                                " );
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}